

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove.hpp
# Opt level: O2

int __thiscall njoy::ENDFtk::tree::File::remove(File *this,char *__filename)

{
  iterator __position;
  key_type local_14;
  
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::tree::Section>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
               ::find(&(this->sections_)._M_t,&local_14);
  if ((_Rb_tree_header *)__position._M_node != &(this->sections_)._M_t._M_impl.super__Rb_tree_header
     ) {
    __position = std::
                 _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::Section>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::Section>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Section>>>
                 ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::Section>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::Section>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Section>>>
                                     *)&this->sections_,__position);
  }
  return (int)__position._M_node;
}

Assistant:

void remove( int mt ) {

  auto iter = this->sections_.find( mt );
  if ( iter != this->sections_.end() ) {

    this->sections_.erase( iter );
  }
}